

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>::
     transfer<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  undefined1 local_21;
  slot_type *psStack_20;
  type is_relocatable;
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>
  *alloc_local;
  
  psStack_20 = old_slot;
  memset(&local_21,0,1);
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
  ::emplace(new_slot);
  std::
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
  ::
  construct<std::pair<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>,std::pair<std::__cxx11::string,std::pair<unsigned_long,unsigned_long>>>
            (alloc,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
                    *)&new_slot->value,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
              *)&psStack_20->value);
  destroy<std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_long,unsigned_long>>>>
            (alloc,psStack_20);
  return;
}

Assistant:

static auto transfer(Allocator* alloc, slot_type* new_slot,
                       slot_type* old_slot) {
    auto is_relocatable =
        typename absl::is_trivially_relocatable<value_type>::type();

    emplace(new_slot);
#if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606
    if (is_relocatable) {
      // TODO(b/247130232,b/251814870): remove casts after fixing warnings.
      std::memcpy(static_cast<void*>(std::launder(&new_slot->value)),
                  static_cast<const void*>(&old_slot->value),
                  sizeof(value_type));
      return is_relocatable;
    }
#endif

    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(
          *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                   std::move(old_slot->value));
    }
    destroy(alloc, old_slot);
    return is_relocatable;
  }